

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O0

string * __thiscall wallet::SQLiteDatabase::Filename_abi_cxx11_(SQLiteDatabase *this)

{
  long lVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_00000020,in_stack_00000018);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string Filename() override { return m_file_path; }